

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

FIOBJ fiobj_hash_new(void)

{
  void *__dest;
  int *piVar1;
  undefined1 local_48 [4];
  undefined4 local_44;
  void *local_10;
  fiobj_hash_s *h;
  
  __dest = fio_malloc(0x38);
  local_10 = __dest;
  if (__dest == (void *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c:162"
                    );
    }
    kill(0,2);
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  memset(local_48,0,0x38);
  local_48[0] = 0x2a;
  local_44 = 1;
  memcpy(__dest,local_48,0x38);
  return (ulong)local_10 | 4;
}

Assistant:

FIOBJ fiobj_hash_new(void) {
  fiobj_hash_s *h = fio_malloc(sizeof(*h));
  FIO_ASSERT_ALLOC(h);
  *h = (fiobj_hash_s){.head = {.ref = 1, .type = FIOBJ_T_HASH},
                      .hash = FIO_SET_INIT};
  return (FIOBJ)h | FIOBJECT_HASH_FLAG;
}